

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<6,_2,_13,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  int row;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Mat4 m;
  Vec4 *local_100;
  ulong local_f8;
  float local_f0 [6];
  float local_d8 [4];
  float local_c8 [6];
  float local_b0 [3];
  float local_a4 [3];
  Matrix<float,_4,_4> local_98;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  puVar1 = &local_58;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar5 = 0;
      }
      *(undefined4 *)((long)puVar1 + lVar4) = uVar5;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  local_58 = *(undefined8 *)evalCtx->in[0].m_data;
  uStack_50 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
  local_48 = *(undefined8 *)evalCtx->in[1].m_data;
  uStack_40 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_38 = *(undefined8 *)evalCtx->in[2].m_data;
  uStack_30 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_28 = *(undefined8 *)evalCtx->in[3].m_data;
  uStack_20 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  negate<float,4,4>(&local_98,(MatrixCaseUtils *)&local_58,(Matrix<float,_4,_4> *)&DAT_00000004);
  local_a4[0] = local_98.m_data.m_data[0].m_data[0];
  local_a4[1] = local_98.m_data.m_data[0].m_data[1];
  local_a4[2] = local_98.m_data.m_data[0].m_data[2];
  local_b0[0] = local_98.m_data.m_data[1].m_data[1];
  local_b0[1] = local_98.m_data.m_data[1].m_data[2];
  local_b0[2] = local_98.m_data.m_data[1].m_data[3];
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar2 = 0;
  do {
    local_d8[lVar2] = local_c8[lVar2 + 9] + local_c8[lVar2 + 6];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c8[3] = local_98.m_data.m_data[2].m_data[2];
  local_c8[4] = local_98.m_data.m_data[2].m_data[3];
  local_c8[5] = local_98.m_data.m_data[2].m_data[0];
  local_100 = (Vec4 *)0x0;
  local_f8 = local_f8 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    *(float *)((long)&local_100 + lVar2 * 4) = local_d8[lVar2] + local_c8[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c8[0] = local_98.m_data.m_data[3].m_data[3];
  local_c8[1] = local_98.m_data.m_data[3].m_data[0];
  local_c8[2] = local_98.m_data.m_data[3].m_data[1];
  local_f0[2] = 0.0;
  local_f0[3] = 0.0;
  local_f0[4] = 0.0;
  lVar2 = 0;
  do {
    local_f0[lVar2 + 2] = *(float *)((long)&local_100 + lVar2 * 4) + local_c8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_100 = &evalCtx->color;
  local_f8 = 0x100000000;
  local_f0[0] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_100 + lVar2 * 4)] = local_f0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(negate(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}